

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getNumberBlock(string *ustring,size_t *index)

{
  bool bVar1;
  uint uVar2;
  const_reference pvVar3;
  size_type sVar4;
  pointer pcVar5;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t *index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  double pval;
  size_t nindex;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  value_type c;
  size_t ii;
  bool hasOp;
  size_t ival;
  double val;
  size_type in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  pointer __n;
  size_type in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char in_stack_ffffffffffffff67;
  string *in_stack_ffffffffffffff68;
  ulong local_68;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  size_t *local_8;
  
  pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front(in_stack_ffffffffffffff40);
  if (*pvVar3 == '(') {
    bVar1 = segmentcheck(in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
    if (!bVar1) {
      return NAN;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_68 = 0;
    index_00 = (size_t *)
               getDoubleFromString((string *)in_stack_ffffffffffffffb8,
                                   (size_t *)in_stack_ffffffffffffffb0);
    sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa0);
    bVar1 = sVar4 <= local_68;
    if (bVar1) {
      (in_RSI->_M_dataplus)._M_p = (pointer)0x1;
    }
    else {
      local_8 = (size_t *)0x7ff4000000000000;
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff50 = local_68;
    if (!bVar1) {
      return (double)local_8;
    }
  }
  else {
    index_00 = (size_t *)
               getDoubleFromString((string *)in_stack_ffffffffffffffb8,
                                   (size_t *)in_stack_ffffffffffffffb0);
  }
  uVar2 = std::isnan((double)index_00);
  local_8 = index_00;
  if ((uVar2 & 1) == 0) {
    __n = (in_RSI->_M_dataplus)._M_p;
    pcVar5 = (pointer)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (in_RDI);
    local_8 = index_00;
    if ((__n < pcVar5) &&
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), local_8 = index_00
       , *pvVar3 == '^')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50,(size_type)__n);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             getNumberBlock(in_RSI,index_00);
      std::__cxx11::string::~string(this);
      uVar2 = std::isnan((double)this);
      if ((uVar2 & 1) == 0) {
        (in_RSI->_M_dataplus)._M_p = (in_RSI->_M_dataplus)._M_p + 1;
        local_8 = (size_t *)pow((double)index_00,(double)this);
      }
      else {
        (in_RSI->_M_dataplus)._M_p = (pointer)0x0;
        local_8 = (size_t *)0x7ff4000000000000;
      }
    }
  }
  return (double)local_8;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}